

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O2

void __thiscall despot::POMDPX::PrintDefaultActions(POMDPX *this)

{
  uint uVar1;
  ulong uVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  uVar1 = (*(this->super_MDP)._vptr_MDP[2])();
  uVar5 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar5;
  }
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"s = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar4);
    poVar3 = std::operator<<(poVar3," ");
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_48,
               &(this->states_).
                super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar4]->vec_id);
    poVar3 = despot::operator<<(poVar3,(vector<int,_std::allocator<int>_> *)&local_48);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = despot::operator<<(poVar3,(ValuedAction *)
                                       ((long)&((this->super_MDP).policy_.
                                                super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->action +
                                       uVar5));
    std::endl<char,std::char_traits<char>>(poVar3);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    (*(this->super_MDP)._vptr_MDP[0x15])
              (this,(this->states_).
                    super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar4],&std::cout);
    uVar5 = uVar5 + 0x10;
  }
  return;
}

Assistant:

void POMDPX::PrintDefaultActions() {
	int num_states = NumStates();
	for (int s = 0; s < num_states; s++) {
		cout << "s = " << s << " " << states_[s]->vec_id << " " << policy_[s]
			<< endl;
		PrintState(*states_[s]);
	}
}